

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

uint8_t pull_u8(uchar **cursor,size_t *max)

{
  uint8_t *__src;
  size_t sVar1;
  uint8_t v;
  uint8_t local_19;
  
  sVar1 = *max;
  __src = *cursor;
  if (sVar1 == 0) {
    memcpy(&local_19,__src,0);
    sVar1 = 0;
    memset(&local_19,0,1);
    *cursor = (uchar *)0x0;
  }
  else {
    local_19 = *__src;
    *cursor = __src + 1;
    sVar1 = sVar1 - 1;
  }
  *max = sVar1;
  return local_19;
}

Assistant:

uint8_t pull_u8(const unsigned char **cursor, size_t *max)
{
    uint8_t v;
    pull_bytes(&v, sizeof(v), cursor, max);
    return v;
}